

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::bevel_selected_element(Scene *this)

{
  SceneObject *pSVar1;
  Mesh *local_30;
  Mesh *mesh;
  Scene *this_local;
  
  if ((this->edited).element != (this->selected).element) {
    pSVar1 = (this->selected).object;
    if (pSVar1 == (SceneObject *)0x0) {
      local_30 = (Mesh *)0x0;
    }
    else {
      local_30 = (Mesh *)__dynamic_cast(pSVar1,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    }
    if (local_30 != (Mesh *)0x0) {
      Mesh::bevel_selected_element(local_30);
      memcpy(&this->edited,&this->selected,0x2c);
    }
  }
  return;
}

Assistant:

void Scene::bevel_selected_element()
{
   // Don't re-bevel an element that we're already editing (i.e., beveling)
   if( edited.element == selected.element ) return;

   Mesh* mesh = dynamic_cast<Mesh*>( selected.object );
   if( mesh )
   {
      mesh->bevel_selected_element();
      edited = selected;
   }
}